

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_subsystem.c
# Opt level: O2

void oonf_subsystem_extract_name(oonf_subsystem_namebuf *pluginname,char *libname)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  oonf_libdata *poVar4;
  size_t sVar5;
  size_t sVar6;
  char *__s;
  long lVar7;
  
  pluginname->name[0x10] = '\0';
  pluginname->name[0x11] = '\0';
  pluginname->name[0x12] = '\0';
  pluginname->name[0x13] = '\0';
  pluginname->name[0x14] = '\0';
  pluginname->name[0x15] = '\0';
  pluginname->name[0x16] = '\0';
  pluginname->name[0x17] = '\0';
  pluginname->name[0x18] = '\0';
  pluginname->name[0x19] = '\0';
  pluginname->name[0x1a] = '\0';
  pluginname->name[0x1b] = '\0';
  pluginname->name[0x1c] = '\0';
  pluginname->name[0x1d] = '\0';
  pluginname->name[0x1e] = '\0';
  pluginname->name[0x1f] = '\0';
  pluginname->name[0] = '\0';
  pluginname->name[1] = '\0';
  pluginname->name[2] = '\0';
  pluginname->name[3] = '\0';
  pluginname->name[4] = '\0';
  pluginname->name[5] = '\0';
  pluginname->name[6] = '\0';
  pluginname->name[7] = '\0';
  pluginname->name[8] = '\0';
  pluginname->name[9] = '\0';
  pluginname->name[10] = '\0';
  pluginname->name[0xb] = '\0';
  pluginname->name[0xc] = '\0';
  pluginname->name[0xd] = '\0';
  pluginname->name[0xe] = '\0';
  pluginname->name[0xf] = '\0';
  sVar2 = strlen(libname);
  pcVar3 = strrchr(libname,0x2f);
  if (pcVar3 == (char *)0x0) {
    pcVar3 = strrchr(libname,0x5c);
    if (pcVar3 == (char *)0x0) {
      lVar7 = 0;
      goto LAB_00106f74;
    }
  }
  lVar7 = (long)pcVar3 - (long)libname;
LAB_00106f74:
  poVar4 = oonf_log_get_libdata();
  pcVar3 = poVar4->sharedlibrary_prefix;
  sVar5 = strlen(pcVar3);
  iVar1 = strncasecmp(libname + lVar7,pcVar3,sVar5);
  if (iVar1 == 0) {
    poVar4 = oonf_log_get_libdata();
    sVar5 = strlen(poVar4->sharedlibrary_prefix);
    lVar7 = lVar7 + sVar5;
  }
  __s = libname + lVar7;
  poVar4 = oonf_log_get_libdata();
  pcVar3 = poVar4->sharedlibrary_postfix;
  sVar5 = strlen(__s);
  sVar6 = strlen(pcVar3);
  if (sVar6 <= sVar5 && sVar5 - sVar6 != 0) {
    iVar1 = strcasecmp(__s + (sVar5 - sVar6),pcVar3);
    if (iVar1 == 0) {
      poVar4 = oonf_log_get_libdata();
      sVar5 = strlen(poVar4->sharedlibrary_prefix);
      sVar2 = sVar2 - sVar5;
    }
  }
  if ((sVar2 - lVar7) + 1 < 0x21) {
    memcpy(pluginname,__s,sVar2 - lVar7);
    return;
  }
  return;
}

Assistant:

void
oonf_subsystem_extract_name(struct oonf_subsystem_namebuf *pluginname, const char *libname) {
  size_t start, end;
  char *ptr;

  memset(pluginname, 0, sizeof(*pluginname));

  start = 0;
  end = strlen(libname);

  /* remove path */
  if ((ptr = strrchr(libname, '/')) != NULL) {
    start += (ptr - libname);
  }
  else if ((ptr = strrchr(libname, '\\')) != NULL) {
    start += (ptr - libname);
  }

  /* remove (oonf/app) lib prefix */
  if (str_startswith_nocase(&libname[start], oonf_log_get_libdata()->sharedlibrary_prefix)) {
    start += strlen(oonf_log_get_libdata()->sharedlibrary_prefix);
  }

  /* remove (oonf/app) lib postfix */
  if (str_endswith_nocase(&libname[start], oonf_log_get_libdata()->sharedlibrary_postfix)) {
    end -= strlen(oonf_log_get_libdata()->sharedlibrary_prefix);
  }

  if (end - start + 1 <= sizeof(*pluginname)) {
    memcpy(pluginname->name, &libname[start], end - start);
  }
}